

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

ArenaBlock * __thiscall
google::protobuf::internal::ThreadSafeArena::FirstBlock
          (ThreadSafeArena *this,void *buf,size_t size,AllocationPolicy *policy)

{
  bool bVar1;
  ArenaBlock *pAVar2;
  Nullable<const_char_*> failure_msg;
  SizedPtr SVar3;
  uint local_34;
  LogMessageFatal local_30;
  
  SVar3.n = size;
  SVar3.p = buf;
  bVar1 = AllocationPolicy::IsDefault(policy);
  if (bVar1) {
    pAVar2 = FirstBlock(this,buf,size);
    return pAVar2;
  }
  local_30.super_LogMessage._0_8_ = ZEXT48((uint)buf & 7);
  local_34 = 0;
  failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_long,unsigned_int>
                          ((unsigned_long *)&local_30,&local_34,
                           "reinterpret_cast<uintptr_t>(buf) & 7 == 0u");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    if (size < 0x30 || buf == (void *)0x0) {
      SVar3 = anon_unknown_12::AllocateBlock(policy,0,0x20);
    }
    else {
      *(undefined1 *)buf = 0;
      *(undefined1 *)((long)buf + (size - 1)) = 0;
      *(byte *)&(this->alloc_policy_).policy_ = (byte)(this->alloc_policy_).policy_ | 1;
    }
    ArenaBlock::ArenaBlock((ArenaBlock *)SVar3.p,(ArenaBlock *)0x0,SVar3.n);
    return (ArenaBlock *)SVar3.p;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena.cc"
             ,0x255,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_30);
}

Assistant:

ArenaBlock* ThreadSafeArena::FirstBlock(void* buf, size_t size,
                                        const AllocationPolicy& policy) {
  if (policy.IsDefault()) return FirstBlock(buf, size);

  ABSL_DCHECK_EQ(reinterpret_cast<uintptr_t>(buf) & 7, 0u);

  SizedPtr mem;
  if (buf == nullptr || size < kBlockHeaderSize + kAllocPolicySize) {
    mem = AllocateBlock(&policy, 0, kAllocPolicySize);
  } else {
    mem = {buf, size};
    // Record user-owned block.
    if constexpr (internal::PerformDebugChecks()) {
      // Touch block to verify it is addressable.
      if (size > 0) {
        static_cast<char*>(buf)[0] = 0;
        static_cast<char*>(buf)[size - 1] = 0;
      }
    }
    ABSL_ANNOTATE_MEMORY_IS_UNINITIALIZED(buf, size);
    alloc_policy_.set_is_user_owned_initial_block(true);
  }

  return new (mem.p) ArenaBlock{nullptr, mem.n};
}